

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O3

void __thiscall TestMustache::testFalsiness(TestMustache *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  char cVar7;
  QVariant *pQVar8;
  QVariant *pQVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QVariant moved;
  QVariantHash data;
  QVariant moved_1;
  Private __tmp;
  Renderer renderer;
  undefined1 local_1c8 [24];
  QVariant *pQStack_1b0;
  Data *local_1a8;
  QHash<QString,_QVariant> local_1a0;
  anon_union_24_3_e3d07ef4_for_data local_198;
  undefined8 uStack_180;
  QString local_178;
  QString local_158;
  anon_union_24_3_e3d07ef4_for_data local_138;
  QVariant *pQStack_120;
  QString local_118;
  QtVariantContext local_f8;
  Renderer local_c8;
  
  Mustache::Renderer::Renderer(&local_c8);
  local_1a0.d = (Data *)0x0;
  QVar10.m_data = (storage_type *)0x2a;
  QVar10.m_size = (qsizetype)&local_f8;
  QString::fromUtf8(QVar10);
  local_118.d.d = (Data *)local_f8.super_Context._vptr_Context;
  local_118.d.ptr = (char16_t *)local_f8.super_Context.m_partialResolver;
  local_118.d.size = (qsizetype)local_f8.m_contextStack.super_QList<QVariant>.d.d;
  ::QVariant::QVariant((QVariant *)&local_138,0);
  QVar11.m_data = (storage_type *)0x4;
  QVar11.m_size = (qsizetype)&local_f8;
  QString::fromUtf8(QVar11);
  local_198.shared = (PrivateShared *)local_f8.super_Context._vptr_Context;
  local_198._8_8_ = local_f8.super_Context.m_partialResolver;
  local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.d;
  pQVar8 = QHash<QString,_QVariant>::operator[](&local_1a0,(QString *)&local_198);
  pQVar9 = pQStack_120;
  uVar3 = local_138._16_8_;
  uVar2 = local_138._8_8_;
  uVar1 = local_138.shared;
  local_138.shared = (PrivateShared *)0x0;
  local_138._8_8_ = 0;
  local_138._16_8_ = (QArrayData *)0x0;
  pQStack_120 = (QVariant *)0x2;
  local_1c8._0_8_ = (pQVar8->d).data.shared;
  local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar8->d).data + 8);
  local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar8->d).data + 0x10);
  pQStack_1b0 = *(QVariant **)&(pQVar8->d).field_0x18;
  *(undefined8 *)((long)&(pQVar8->d).data + 0x10) = uVar3;
  *(QVariant **)&(pQVar8->d).field_0x18 = pQVar9;
  (pQVar8->d).data.shared = (PrivateShared *)uVar1;
  *(undefined8 *)((long)&(pQVar8->d).data + 8) = uVar2;
  local_f8.super_Context._vptr_Context = (_func_int **)local_1c8._0_8_;
  local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
  local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
  local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
  ::QVariant::~QVariant((QVariant *)local_1c8);
  if ((QArrayData *)local_198.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_198.shared = *(int *)local_198.shared + -1;
    UNLOCK();
    if (*(int *)local_198.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_198.shared,2,8);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_138);
  ::QVariant::QVariant((QVariant *)local_1c8,(QHash *)&local_1a0);
  Mustache::QtVariantContext::QtVariantContext
            (&local_f8,(QVariant *)local_1c8,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)local_1c8);
  Mustache::Renderer::render(&local_178,&local_c8,&local_118,&local_f8.super_Context);
  if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
    cVar7 = QTest::qVerify(true,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
  }
  else {
    cVar7 = QTest::qVerify(false,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
  }
  if (cVar7 != '\0') {
    ::QVariant::QVariant((QVariant *)&local_198,0);
    QVar12.m_data = (storage_type *)0x4;
    QVar12.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar12);
    local_158.d.d = (Data *)local_1c8._0_8_;
    local_158.d.ptr = (char16_t *)local_1c8._8_8_;
    local_158.d.size = local_1c8._16_8_;
    pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
    uVar4 = uStack_180;
    uVar3 = local_198._16_8_;
    uVar2 = local_198._8_8_;
    uVar1 = local_198.shared;
    local_198.shared = (PrivateShared *)0x0;
    local_198._8_8_ = 0;
    local_198._16_8_ = 0;
    uStack_180 = 2;
    local_1c8._0_8_ = (pQVar9->d).data.shared;
    local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
    local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
    pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
    *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
    *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
    (pQVar9->d).data.shared = (PrivateShared *)uVar1;
    *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
    local_138.shared = (PrivateShared *)local_1c8._0_8_;
    local_138._8_8_ = local_1c8._8_8_;
    local_138._16_8_ = local_1c8._16_8_;
    pQStack_120 = pQStack_1b0;
    ::QVariant::~QVariant((QVariant *)&local_138);
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_198);
    ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
    Mustache::QtVariantContext::QtVariantContext
              ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
    local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
    local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
    local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
    local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
    local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
    local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
    local_1c8._16_8_ = (QArrayData *)0x0;
    pQStack_1b0 = (QVariant *)0x0;
    local_1a8 = (Data *)0x0;
    local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198);
    local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
    QArrayDataPointer<QVariant>::~QArrayDataPointer
              ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
    ::QVariant::~QVariant((QVariant *)&local_138);
    Mustache::Renderer::render((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
    pcVar6 = local_178.d.ptr;
    pDVar5 = local_178.d.d;
    uVar2 = local_1c8._16_8_;
    uVar1 = local_1c8._0_8_;
    local_1c8._0_8_ = local_178.d.d;
    local_178.d.d = (Data *)uVar1;
    local_178.d.ptr = (char16_t *)local_1c8._8_8_;
    local_1c8._8_8_ = pcVar6;
    local_1c8._16_8_ = local_178.d.size;
    local_178.d.size = uVar2;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
      }
    }
    if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
      cVar7 = QTest::qVerify(true,"output.isEmpty()","0u evaluated as truthy",
                             "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                             ,0x92);
    }
    else {
      cVar7 = QTest::qVerify(false,"output.isEmpty()","0u evaluated as truthy",
                             "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                             ,0x92);
    }
    if (cVar7 != '\0') {
      ::QVariant::QVariant((QVariant *)&local_198,0);
      QVar13.m_data = (storage_type *)0x4;
      QVar13.m_size = (qsizetype)local_1c8;
      QString::fromUtf8(QVar13);
      local_158.d.d = (Data *)local_1c8._0_8_;
      local_158.d.ptr = (char16_t *)local_1c8._8_8_;
      local_158.d.size = local_1c8._16_8_;
      pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
      uVar4 = uStack_180;
      uVar3 = local_198._16_8_;
      uVar2 = local_198._8_8_;
      uVar1 = local_198.shared;
      local_198.shared = (PrivateShared *)0x0;
      local_198._8_8_ = 0;
      local_198._16_8_ = 0;
      uStack_180 = 2;
      local_1c8._0_8_ = (pQVar9->d).data.shared;
      local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
      local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
      pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
      *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
      *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
      (pQVar9->d).data.shared = (PrivateShared *)uVar1;
      *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
      local_138.shared = (PrivateShared *)local_1c8._0_8_;
      local_138._8_8_ = local_1c8._8_8_;
      local_138._16_8_ = local_1c8._16_8_;
      pQStack_120 = pQStack_1b0;
      ::QVariant::~QVariant((QVariant *)&local_138);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_198);
      ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
      Mustache::QtVariantContext::QtVariantContext
                ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
      local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
      local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
      local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
      local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
      local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
      local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
      local_1c8._16_8_ = (QArrayData *)0x0;
      pQStack_1b0 = (QVariant *)0x0;
      local_1a8 = (Data *)0x0;
      local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198);
      local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
      QArrayDataPointer<QVariant>::~QArrayDataPointer
                ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
      ::QVariant::~QVariant((QVariant *)&local_138);
      Mustache::Renderer::render((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
      pcVar6 = local_178.d.ptr;
      pDVar5 = local_178.d.d;
      uVar2 = local_1c8._16_8_;
      uVar1 = local_1c8._0_8_;
      local_1c8._0_8_ = local_178.d.d;
      local_178.d.d = (Data *)uVar1;
      local_178.d.ptr = (char16_t *)local_1c8._8_8_;
      local_1c8._8_8_ = pcVar6;
      local_1c8._16_8_ = local_178.d.size;
      local_178.d.size = uVar2;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
        }
      }
      if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
        cVar7 = QTest::qVerify(true,"output.isEmpty()","0ll evaluated as truthy",
                               "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                               ,0x98);
      }
      else {
        cVar7 = QTest::qVerify(false,"output.isEmpty()","0ll evaluated as truthy",
                               "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                               ,0x98);
      }
      if (cVar7 != '\0') {
        ::QVariant::QVariant((QVariant *)&local_198,0);
        QVar14.m_data = (storage_type *)0x4;
        QVar14.m_size = (qsizetype)local_1c8;
        QString::fromUtf8(QVar14);
        local_158.d.d = (Data *)local_1c8._0_8_;
        local_158.d.ptr = (char16_t *)local_1c8._8_8_;
        local_158.d.size = local_1c8._16_8_;
        pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
        uVar4 = uStack_180;
        uVar3 = local_198._16_8_;
        uVar2 = local_198._8_8_;
        uVar1 = local_198.shared;
        local_198.shared = (PrivateShared *)0x0;
        local_198._8_8_ = 0;
        local_198._16_8_ = 0;
        uStack_180 = 2;
        local_1c8._0_8_ = (pQVar9->d).data.shared;
        local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
        local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
        pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
        *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
        *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
        (pQVar9->d).data.shared = (PrivateShared *)uVar1;
        *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
        local_138.shared = (PrivateShared *)local_1c8._0_8_;
        local_138._8_8_ = local_1c8._8_8_;
        local_138._16_8_ = local_1c8._16_8_;
        pQStack_120 = pQStack_1b0;
        ::QVariant::~QVariant((QVariant *)&local_138);
        if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
          }
        }
        ::QVariant::~QVariant((QVariant *)&local_198);
        ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
        Mustache::QtVariantContext::QtVariantContext
                  ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
        local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
        local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
        local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
        local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
        local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
        local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
        local_1c8._16_8_ = (QArrayData *)0x0;
        pQStack_1b0 = (QVariant *)0x0;
        local_1a8 = (Data *)0x0;
        local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198);
        local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
        QArrayDataPointer<QVariant>::~QArrayDataPointer
                  ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
        ::QVariant::~QVariant((QVariant *)&local_138);
        Mustache::Renderer::render
                  ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
        pcVar6 = local_178.d.ptr;
        pDVar5 = local_178.d.d;
        uVar2 = local_1c8._16_8_;
        uVar1 = local_1c8._0_8_;
        local_1c8._0_8_ = local_178.d.d;
        local_178.d.d = (Data *)uVar1;
        local_178.d.ptr = (char16_t *)local_1c8._8_8_;
        local_1c8._8_8_ = pcVar6;
        local_1c8._16_8_ = local_178.d.size;
        local_178.d.size = uVar2;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
          }
        }
        if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
          cVar7 = QTest::qVerify(true,"output.isEmpty()","0ull evaluated as truthy",
                                 "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                 ,0x9e);
        }
        else {
          cVar7 = QTest::qVerify(false,"output.isEmpty()","0ull evaluated as truthy",
                                 "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                 ,0x9e);
        }
        if (cVar7 != '\0') {
          ::QVariant::QVariant((QVariant *)&local_198,0.0);
          QVar15.m_data = (storage_type *)0x4;
          QVar15.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar15);
          local_158.d.d = (Data *)local_1c8._0_8_;
          local_158.d.ptr = (char16_t *)local_1c8._8_8_;
          local_158.d.size = local_1c8._16_8_;
          pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
          uVar4 = uStack_180;
          uVar3 = local_198._16_8_;
          uVar2 = local_198._8_8_;
          uVar1 = local_198.shared;
          local_198.shared = (PrivateShared *)0x0;
          local_198._8_8_ = 0;
          local_198._16_8_ = 0;
          uStack_180 = 2;
          local_1c8._0_8_ = (pQVar9->d).data.shared;
          local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
          local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
          pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
          *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
          *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
          (pQVar9->d).data.shared = (PrivateShared *)uVar1;
          *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
          local_138.shared = (PrivateShared *)local_1c8._0_8_;
          local_138._8_8_ = local_1c8._8_8_;
          local_138._16_8_ = local_1c8._16_8_;
          pQStack_120 = pQStack_1b0;
          ::QVariant::~QVariant((QVariant *)&local_138);
          if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
            }
          }
          ::QVariant::~QVariant((QVariant *)&local_198);
          ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
          Mustache::QtVariantContext::QtVariantContext
                    ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
          local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
          local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
          local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
          local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
          local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
          local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
          local_1c8._16_8_ = (QArrayData *)0x0;
          pQStack_1b0 = (QVariant *)0x0;
          local_1a8 = (Data *)0x0;
          local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
          QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_198)
          ;
          local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
          QArrayDataPointer<QVariant>::~QArrayDataPointer
                    ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
          ::QVariant::~QVariant((QVariant *)&local_138);
          Mustache::Renderer::render
                    ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
          pcVar6 = local_178.d.ptr;
          pDVar5 = local_178.d.d;
          uVar2 = local_1c8._16_8_;
          uVar1 = local_1c8._0_8_;
          local_1c8._0_8_ = local_178.d.d;
          local_178.d.d = (Data *)uVar1;
          local_178.d.ptr = (char16_t *)local_1c8._8_8_;
          local_1c8._8_8_ = pcVar6;
          local_1c8._16_8_ = local_178.d.size;
          local_178.d.size = uVar2;
          if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
            }
          }
          if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
            cVar7 = QTest::qVerify(true,"output.isEmpty()","0.0 evaluated as truthy",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xa4);
          }
          else {
            cVar7 = QTest::qVerify(false,"output.isEmpty()","0.0 evaluated as truthy",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xa4);
          }
          if (cVar7 != '\0') {
            ::QVariant::QVariant((QVariant *)&local_198,0.4);
            QVar16.m_data = (storage_type *)0x4;
            QVar16.m_size = (qsizetype)local_1c8;
            QString::fromUtf8(QVar16);
            local_158.d.d = (Data *)local_1c8._0_8_;
            local_158.d.ptr = (char16_t *)local_1c8._8_8_;
            local_158.d.size = local_1c8._16_8_;
            pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
            uVar4 = uStack_180;
            uVar3 = local_198._16_8_;
            uVar2 = local_198._8_8_;
            uVar1 = local_198.shared;
            local_198.shared = (PrivateShared *)0x0;
            local_198._8_8_ = 0;
            local_198._16_8_ = 0;
            uStack_180 = 2;
            local_1c8._0_8_ = (pQVar9->d).data.shared;
            local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
            local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
            pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
            *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
            *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
            (pQVar9->d).data.shared = (PrivateShared *)uVar1;
            *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
            local_138.shared = (PrivateShared *)local_1c8._0_8_;
            local_138._8_8_ = local_1c8._8_8_;
            local_138._16_8_ = local_1c8._16_8_;
            pQStack_120 = pQStack_1b0;
            ::QVariant::~QVariant((QVariant *)&local_138);
            if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
              }
            }
            ::QVariant::~QVariant((QVariant *)&local_198);
            ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
            Mustache::QtVariantContext::QtVariantContext
                      ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0);
            local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
            local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
            local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
            local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
            local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
            local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
            local_1c8._16_8_ = (QArrayData *)0x0;
            pQStack_1b0 = (QVariant *)0x0;
            local_1a8 = (Data *)0x0;
            local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
            QArrayDataPointer<QVariant>::~QArrayDataPointer
                      ((QArrayDataPointer<QVariant> *)&local_198);
            local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
            QArrayDataPointer<QVariant>::~QArrayDataPointer
                      ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
            ::QVariant::~QVariant((QVariant *)&local_138);
            Mustache::Renderer::render
                      ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
            pcVar6 = local_178.d.ptr;
            pDVar5 = local_178.d.d;
            uVar2 = local_1c8._16_8_;
            uVar1 = local_1c8._0_8_;
            local_1c8._0_8_ = local_178.d.d;
            local_178.d.d = (Data *)uVar1;
            local_178.d.ptr = (char16_t *)local_1c8._8_8_;
            local_1c8._8_8_ = pcVar6;
            local_1c8._16_8_ = local_178.d.size;
            local_178.d.size = uVar2;
            if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
              }
            }
            if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
              cVar7 = QTest::qVerify(false,"!output.isEmpty()","0.4 evaluated as falsey",
                                     "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                     ,0xaa);
            }
            else {
              cVar7 = QTest::qVerify(true,"!output.isEmpty()","0.4 evaluated as falsey",
                                     "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                     ,0xaa);
            }
            if (cVar7 != '\0') {
              ::QVariant::QVariant((QVariant *)&local_198,0.5);
              QString::QString(&local_158,"bool");
              pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
              uVar4 = uStack_180;
              uVar3 = local_198._16_8_;
              uVar2 = local_198._8_8_;
              uVar1 = local_198.shared;
              local_198.shared = (PrivateShared *)0x0;
              local_198._8_8_ = 0;
              local_198._16_8_ = 0;
              uStack_180 = 2;
              local_1c8._0_8_ = (pQVar9->d).data.shared;
              local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
              local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
              pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
              *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
              *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
              (pQVar9->d).data.shared = (PrivateShared *)uVar1;
              *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
              local_138.shared = (PrivateShared *)local_1c8._0_8_;
              local_138._8_8_ = local_1c8._8_8_;
              local_138._16_8_ = local_1c8._16_8_;
              pQStack_120 = pQStack_1b0;
              ::QVariant::~QVariant((QVariant *)&local_138);
              if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                }
              }
              ::QVariant::~QVariant((QVariant *)&local_198);
              ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
              Mustache::QtVariantContext::QtVariantContext
                        ((QtVariantContext *)local_1c8,(QVariant *)&local_138,(PartialResolver *)0x0
                        );
              local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
              local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
              local_198.shared = (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
              local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
              local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
              local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
              local_1c8._16_8_ = (QArrayData *)0x0;
              pQStack_1b0 = (QVariant *)0x0;
              local_1a8 = (Data *)0x0;
              local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
              QArrayDataPointer<QVariant>::~QArrayDataPointer
                        ((QArrayDataPointer<QVariant> *)&local_198);
              local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
              QArrayDataPointer<QVariant>::~QArrayDataPointer
                        ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
              ::QVariant::~QVariant((QVariant *)&local_138);
              Mustache::Renderer::render
                        ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
              pcVar6 = local_178.d.ptr;
              pDVar5 = local_178.d.d;
              uVar2 = local_1c8._16_8_;
              uVar1 = local_1c8._0_8_;
              local_1c8._0_8_ = local_178.d.d;
              local_178.d.d = (Data *)uVar1;
              local_178.d.ptr = (char16_t *)local_1c8._8_8_;
              local_1c8._8_8_ = pcVar6;
              local_1c8._16_8_ = local_178.d.size;
              local_178.d.size = uVar2;
              if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                }
              }
              if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
                cVar7 = QTest::qVerify(false,"!output.isEmpty()","0.5f evaluated as falsey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                       ,0xb0);
              }
              else {
                cVar7 = QTest::qVerify(true,"!output.isEmpty()","0.5f evaluated as falsey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                       ,0xb0);
              }
              if (cVar7 != '\0') {
                ::QVariant::QVariant((QVariant *)&local_198,0.0);
                QString::QString(&local_158,"bool");
                pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
                uVar4 = uStack_180;
                uVar3 = local_198._16_8_;
                uVar2 = local_198._8_8_;
                uVar1 = local_198.shared;
                local_198.shared = (PrivateShared *)0x0;
                local_198._8_8_ = 0;
                local_198._16_8_ = 0;
                uStack_180 = 2;
                local_1c8._0_8_ = (pQVar9->d).data.shared;
                local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
                local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
                pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
                *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
                *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
                (pQVar9->d).data.shared = (PrivateShared *)uVar1;
                *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
                local_138.shared = (PrivateShared *)local_1c8._0_8_;
                local_138._8_8_ = local_1c8._8_8_;
                local_138._16_8_ = local_1c8._16_8_;
                pQStack_120 = pQStack_1b0;
                ::QVariant::~QVariant((QVariant *)&local_138);
                if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                  }
                }
                ::QVariant::~QVariant((QVariant *)&local_198);
                ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
                Mustache::QtVariantContext::QtVariantContext
                          ((QtVariantContext *)local_1c8,(QVariant *)&local_138,
                           (PartialResolver *)0x0);
                local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
                local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
                local_198.shared =
                     (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
                local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
                local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
                local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
                local_1c8._16_8_ = (QArrayData *)0x0;
                pQStack_1b0 = (QVariant *)0x0;
                local_1a8 = (Data *)0x0;
                local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
                QArrayDataPointer<QVariant>::~QArrayDataPointer
                          ((QArrayDataPointer<QVariant> *)&local_198);
                local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
                QArrayDataPointer<QVariant>::~QArrayDataPointer
                          ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
                ::QVariant::~QVariant((QVariant *)&local_138);
                Mustache::Renderer::render
                          ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
                pcVar6 = local_178.d.ptr;
                pDVar5 = local_178.d.d;
                uVar2 = local_1c8._16_8_;
                uVar1 = local_1c8._0_8_;
                local_1c8._0_8_ = local_178.d.d;
                local_178.d.d = (Data *)uVar1;
                local_178.d.ptr = (char16_t *)local_1c8._8_8_;
                local_1c8._8_8_ = pcVar6;
                local_1c8._16_8_ = local_178.d.size;
                local_178.d.size = uVar2;
                if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                  }
                }
                if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
                  cVar7 = QTest::qVerify(true,"output.isEmpty()","0.0f evaluated as truthy",
                                         "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                         ,0xb6);
                }
                else {
                  cVar7 = QTest::qVerify(false,"output.isEmpty()","0.0f evaluated as truthy",
                                         "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                         ,0xb6);
                }
                if (cVar7 != '\0') {
                  ::QVariant::QVariant((QVariant *)&local_198,0);
                  QString::QString(&local_158,"bool");
                  pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
                  uVar4 = uStack_180;
                  uVar3 = local_198._16_8_;
                  uVar2 = local_198._8_8_;
                  uVar1 = local_198.shared;
                  local_198.shared = (PrivateShared *)0x0;
                  local_198._8_8_ = 0;
                  local_198._16_8_ = 0;
                  uStack_180 = 2;
                  local_1c8._0_8_ = (pQVar9->d).data.shared;
                  local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
                  local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
                  pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
                  *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
                  *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
                  (pQVar9->d).data.shared = (PrivateShared *)uVar1;
                  *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
                  local_138.shared = (PrivateShared *)local_1c8._0_8_;
                  local_138._8_8_ = local_1c8._8_8_;
                  local_138._16_8_ = local_1c8._16_8_;
                  pQStack_120 = pQStack_1b0;
                  ::QVariant::~QVariant((QVariant *)&local_138);
                  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                    }
                  }
                  ::QVariant::~QVariant((QVariant *)&local_198);
                  ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
                  Mustache::QtVariantContext::QtVariantContext
                            ((QtVariantContext *)local_1c8,(QVariant *)&local_138,
                             (PartialResolver *)0x0);
                  local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
                  local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
                  local_198.shared =
                       (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
                  local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
                  local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
                  local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
                  local_1c8._16_8_ = (QArrayData *)0x0;
                  pQStack_1b0 = (QVariant *)0x0;
                  local_1a8 = (Data *)0x0;
                  local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                            ((QArrayDataPointer<QVariant> *)&local_198);
                  local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                            ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
                  ::QVariant::~QVariant((QVariant *)&local_138);
                  Mustache::Renderer::render
                            ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
                  pcVar6 = local_178.d.ptr;
                  pDVar5 = local_178.d.d;
                  uVar2 = local_1c8._16_8_;
                  uVar1 = local_1c8._0_8_;
                  local_1c8._0_8_ = local_178.d.d;
                  local_178.d.d = (Data *)uVar1;
                  local_178.d.ptr = (char16_t *)local_1c8._8_8_;
                  local_1c8._8_8_ = pcVar6;
                  local_1c8._16_8_ = local_178.d.size;
                  local_178.d.size = uVar2;
                  if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                    }
                  }
                  if ((QArrayData *)local_178.d.size == (QArrayData *)0x0) {
                    cVar7 = QTest::qVerify(true,"output.isEmpty()","\'",
                                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                           ,0xbc);
                  }
                  else {
                    cVar7 = QTest::qVerify(false,"output.isEmpty()","\'",
                                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                           ,0xbc);
                  }
                  if (cVar7 != '\0') {
                    ::QVariant::QVariant((QVariant *)&local_198,false);
                    QString::QString(&local_158,"bool");
                    pQVar9 = QHash<QString,_QVariant>::operator[](&local_1a0,&local_158);
                    uVar4 = uStack_180;
                    uVar3 = local_198._16_8_;
                    uVar2 = local_198._8_8_;
                    uVar1 = local_198.shared;
                    local_198.shared = (PrivateShared *)0x0;
                    local_198._8_8_ = 0;
                    local_198._16_8_ = 0;
                    uStack_180 = 2;
                    local_1c8._0_8_ = (pQVar9->d).data.shared;
                    local_1c8._8_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 8);
                    local_1c8._16_8_ = *(undefined8 *)((long)&(pQVar9->d).data + 0x10);
                    pQStack_1b0 = *(QVariant **)&(pQVar9->d).field_0x18;
                    *(undefined8 *)((long)&(pQVar9->d).data + 0x10) = uVar3;
                    *(undefined8 *)&(pQVar9->d).field_0x18 = uVar4;
                    (pQVar9->d).data.shared = (PrivateShared *)uVar1;
                    *(undefined8 *)((long)&(pQVar9->d).data + 8) = uVar2;
                    local_138.shared = (PrivateShared *)local_1c8._0_8_;
                    local_138._8_8_ = local_1c8._8_8_;
                    local_138._16_8_ = local_1c8._16_8_;
                    pQStack_120 = pQStack_1b0;
                    ::QVariant::~QVariant((QVariant *)&local_138);
                    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
                      }
                    }
                    ::QVariant::~QVariant((QVariant *)&local_198);
                    ::QVariant::QVariant((QVariant *)&local_138,(QHash *)&local_1a0);
                    Mustache::QtVariantContext::QtVariantContext
                              ((QtVariantContext *)local_1c8,(QVariant *)&local_138,
                               (PartialResolver *)0x0);
                    local_198._16_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.size;
                    local_198._8_8_ = local_f8.m_contextStack.super_QList<QVariant>.d.ptr;
                    local_198.shared =
                         (PrivateShared *)local_f8.m_contextStack.super_QList<QVariant>.d.d;
                    local_f8.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)local_1a8;
                    local_f8.m_contextStack.super_QList<QVariant>.d.ptr = pQStack_1b0;
                    local_f8.m_contextStack.super_QList<QVariant>.d.d = (Data *)local_1c8._16_8_;
                    local_1c8._16_8_ = (QArrayData *)0x0;
                    pQStack_1b0 = (QVariant *)0x0;
                    local_1a8 = (Data *)0x0;
                    local_f8.super_Context.m_partialResolver = (PartialResolver *)local_1c8._8_8_;
                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                              ((QArrayDataPointer<QVariant> *)&local_198);
                    local_1c8._0_8_ = &PTR__QtVariantContext_00122c90;
                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                              ((QArrayDataPointer<QVariant> *)(local_1c8 + 0x10));
                    ::QVariant::~QVariant((QVariant *)&local_138);
                    Mustache::Renderer::render
                              ((QString *)local_1c8,&local_c8,&local_118,&local_f8.super_Context);
                    pcVar6 = local_178.d.ptr;
                    pDVar5 = local_178.d.d;
                    uVar2 = local_1c8._16_8_;
                    uVar1 = local_1c8._0_8_;
                    local_1c8._0_8_ = local_178.d.d;
                    local_178.d.d = (Data *)uVar1;
                    local_178.d.ptr = (char16_t *)local_1c8._8_8_;
                    local_1c8._8_8_ = pcVar6;
                    local_1c8._16_8_ = local_178.d.size;
                    local_178.d.size = uVar2;
                    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                           -1;
                      UNLOCK();
                      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                          0) {
                        QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
                      }
                    }
                    QTest::qVerify((QArrayData *)local_178.d.size == (QArrayData *)0x0,
                                   "output.isEmpty()","\'",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xc2);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  local_f8.super_Context._vptr_Context = (_func_int **)&PTR__QtVariantContext_00122c90;
  QArrayDataPointer<QVariant>::~QArrayDataPointer
            ((QArrayDataPointer<QVariant> *)&local_f8.m_contextStack);
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
    }
  }
  QHash<QString,_QVariant>::~QHash(&local_1a0);
  Mustache::Renderer::~Renderer(&local_c8);
  return;
}

Assistant:

void TestMustache::testFalsiness()
{
	Mustache::Renderer renderer;
	QVariantHash data;
	QString _template = "{{#bool}}This should not be shown{{/bool}}";

	// test falsiness of 0
	data["bool"] = 0;
	Mustache::QtVariantContext context = Mustache::QtVariantContext(data);
	QString output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0 evaluated as truthy");

	// test falsiness of 0u
	data["bool"] = 0u;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0u evaluated as truthy");

	// test falsiness of 0ll
	data["bool"] = 0ll;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ll evaluated as truthy");

	// test falsiness of 0ull
	data["bool"] = 0ull;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ull evaluated as truthy");

	// test falsiness of 0.0
	data["bool"] = 0.0;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0 evaluated as truthy");

	// test falsiness of 0.4
	data["bool"] = 0.4f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.4 evaluated as falsey");

	// test falsiness of 0.5
	data["bool"] = 0.5f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.5f evaluated as falsey");

	// test falsiness of 0.0f
	data["bool"] = 0.0f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0f evaluated as truthy");

	// test falsiness of '\0'
	data["bool"] = '\0';
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");

	// test falsiness of 'false'
	data["bool"] = false;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");
}